

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

Code * __thiscall md::Code::not_to_dx(Code *this,DataRegister *reg,Size size)

{
  uint16_t uVar1;
  ushort uVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_38;
  
  uVar2 = 0x4640;
  if (size != WORD) {
    uVar2 = (ushort)(size == LONG) << 7 | 0x4600;
  }
  uVar1 = Param::getMXn((Param *)reg);
  add_word(this,uVar1 + uVar2);
  (*(reg->super_Register).super_Param._vptr_Param[2])(&_Stack_38,reg);
  add_bytes(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_38);
  return this;
}

Assistant:

Code& Code::not_to_dx(const DataRegister& reg, Size size)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t opcode = 0x4600 + (size_code << 6) + reg.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(reg.getAdditionnalData());

    return *this;
}